

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall helics::CommonCore::checkDependencies(CommonCore *this)

{
  BaseTimeCoordinator *pBVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  FedInfo **ppFVar6;
  GlobalFederateId *dep_1;
  long lVar7;
  pointer pGVar8;
  FedInfo **ppFVar9;
  ulong uVar10;
  GlobalFederateId dest;
  FedInfo *pFVar11;
  uint uVar12;
  uint uVar13;
  GlobalFederateId dest_00;
  GlobalFederateId *dep;
  FedInfo **ppFVar14;
  pointer pGVar15;
  ActionMessage rmdep;
  ActionMessage local_1a0;
  ActionMessage local_e8;
  
  if ((this->loopFederates).dataStorage.csize == 0) {
    uVar10 = (ulong)(this->loopFederates).dataStorage.bsize;
    ppFVar14 = (this->loopFederates).dataStorage.dataptr;
    if (uVar10 == 0x20) {
      if (ppFVar14 == (FedInfo **)0x0) {
        ppFVar14 = &gmlc::containers::
                    StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end::
                    emptyValue;
      }
      else {
        ppFVar14 = ppFVar14 + (long)(this->loopFederates).dataStorage.dataSlotIndex + 1;
      }
      pFVar11 = *ppFVar14;
      uVar10 = 0;
    }
    else {
      ppFVar14 = ppFVar14 + (this->loopFederates).dataStorage.dataSlotIndex;
      pFVar11 = *ppFVar14 + uVar10;
    }
  }
  else {
    ppFVar14 = (this->loopFederates).dataStorage.dataptr;
    pFVar11 = *ppFVar14;
    uVar10 = 0;
  }
  uVar5 = (this->loopFederates).dataStorage.bsize;
  ppFVar6 = (this->loopFederates).dataStorage.dataptr;
  lVar7 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
  if (ppFVar6 == (FedInfo **)0x0) {
    ppFVar9 = &gmlc::containers::
               StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end::
               emptyValue;
  }
  else {
    ppFVar9 = ppFVar6 + lVar7 + 1;
  }
  uVar13 = 0;
  uVar12 = uVar5;
  if (uVar5 == 0x20) {
    uVar12 = uVar13;
  }
  ppFVar6 = ppFVar6 + lVar7;
  if (uVar5 == 0x20) {
    ppFVar6 = ppFVar9;
  }
  if (((uint)uVar10 != uVar12) || (bVar3 = false, ppFVar14 != ppFVar6)) {
    uVar13 = 0;
    bVar3 = false;
    do {
      iVar4 = FederateState::endpointCount(pFVar11->fed);
      if (0 < iVar4) {
        bVar2 = FederateState::getOptionFlag(pFVar11->fed,0);
        if (bVar2) {
          pBVar1 = (this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
          (*pBVar1->_vptr_BaseTimeCoordinator[6])
                    (pBVar1,(ulong)(uint)(pFVar11->fed->global_id)._M_i.gid);
          ActionMessage::ActionMessage(&local_1a0,cmd_remove_dependent);
          local_1a0.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
          local_1a0.dest_id.gid = (pFVar11->fed->global_id)._M_i.gid;
          FederateState::addAction(pFVar11->fed,&local_1a0);
          ActionMessage::~ActionMessage(&local_1a0);
          uVar13 = 1;
        }
        else {
          bVar2 = FederateState::getOptionFlag(pFVar11->fed,4);
          if (bVar2) {
            pBVar1 = (this->super_BrokerBase).timeCoord._M_t.
                     super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                     .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
            (*pBVar1->_vptr_BaseTimeCoordinator[7])
                      (pBVar1,(ulong)(uint)(pFVar11->fed->global_id)._M_i.gid);
            ActionMessage::ActionMessage(&local_1a0,cmd_remove_dependency);
            local_1a0.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
            local_1a0.dest_id.gid = (pFVar11->fed->global_id)._M_i.gid;
            FederateState::addAction(pFVar11->fed,&local_1a0);
            ActionMessage::~ActionMessage(&local_1a0);
            bVar3 = true;
          }
        }
      }
      iVar4 = (int)uVar10;
      uVar5 = iVar4 + 1;
      if (iVar4 < 0x1f) {
        pFVar11 = pFVar11 + 1;
      }
      else {
        ppFVar14 = ppFVar14 + (ulong)(iVar4 - 0x1fU >> 5) + 1;
        uVar5 = uVar5 & 0x1f;
        pFVar11 = (FedInfo *)((long)&(*ppFVar14)->fed + (ulong)(uVar5 << 4));
      }
      uVar10 = (ulong)uVar5;
    } while ((uVar5 != uVar12) || (ppFVar14 != ppFVar6));
  }
  BaseTimeCoordinator::getDependents
            ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
             &local_1a0,
             (this->super_BrokerBase).timeCoord._M_t.
             super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
             .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
  uVar10 = CONCAT44(local_1a0.source_handle.hid,local_1a0.source_id.gid) - local_1a0._0_8_;
  if ((pointer)local_1a0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1a0._0_8_,
                    CONCAT44(local_1a0.dest_handle.hid,local_1a0.dest_id.gid) - local_1a0._0_8_);
  }
  if (uVar10 < 9) {
    BaseTimeCoordinator::getDependencies
              ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
               &local_1a0,
               (this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
    uVar10 = CONCAT44(local_1a0.source_handle.hid,local_1a0.source_id.gid) - local_1a0._0_8_;
    if ((pointer)local_1a0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1a0._0_8_,
                      CONCAT44(local_1a0.dest_handle.hid,local_1a0.dest_id.gid) - local_1a0._0_8_);
    }
    if (uVar10 < 9) {
      BaseTimeCoordinator::getDependents
                ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                 &local_1a0,
                 (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
      pGVar8 = (pointer)CONCAT44(local_1a0.source_handle.hid,local_1a0.source_id.gid);
      if ((pointer)local_1a0._0_8_ == pGVar8) {
        iVar4 = 0;
        dest_00.gid = -2010000000;
        dest.gid = -2010000000;
      }
      else {
        dest.gid = -2010000000;
        iVar4 = 0;
        dest_00.gid = -2010000000;
        pGVar15 = (pointer)local_1a0._0_8_;
        do {
          bVar2 = isLocal(this,(GlobalFederateId)pGVar15->gid);
          if (bVar2) {
            iVar4 = iVar4 + 1;
            dest.gid = pGVar15->gid;
          }
          else {
            dest_00.gid = pGVar15->gid;
          }
          pGVar15 = pGVar15 + 1;
        } while (pGVar15 != pGVar8);
      }
      if ((pointer)local_1a0._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1a0._0_8_,
                        CONCAT44(local_1a0.dest_handle.hid,local_1a0.dest_id.gid) - local_1a0._0_8_)
        ;
      }
      if (iVar4 < 2) {
        if ((iVar4 == 0) && ((dest_00.gid == -1700000000 || (dest_00.gid == -2010000000)))) {
          (this->super_BrokerBase).hasTimeDependency = false;
        }
        else {
          BaseTimeCoordinator::getDependencies
                    ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                     &local_1a0,
                     (this->super_BrokerBase).timeCoord._M_t.
                     super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                     .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
          for (pGVar8 = (pointer)local_1a0._0_8_;
              pGVar8 != (pointer)CONCAT44(local_1a0.source_handle.hid,local_1a0.source_id.gid);
              pGVar8 = pGVar8 + 1) {
            if (pGVar8->gid != dest_00.gid && pGVar8->gid != dest.gid) {
              if ((pointer)local_1a0._0_8_ == (pointer)0x0) {
                return;
              }
              operator_delete((void *)local_1a0._0_8_,
                              CONCAT44(local_1a0.dest_handle.hid,local_1a0.dest_id.gid) -
                              local_1a0._0_8_);
              return;
            }
          }
          if ((pointer)local_1a0._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_1a0._0_8_,
                            CONCAT44(local_1a0.dest_handle.hid,local_1a0.dest_id.gid) -
                            local_1a0._0_8_);
          }
          pBVar1 = (this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
          (*pBVar1->_vptr_BaseTimeCoordinator[6])(pBVar1,(ulong)(uint)dest_00.gid);
          pBVar1 = (this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
          (*pBVar1->_vptr_BaseTimeCoordinator[6])(pBVar1,(ulong)(uint)dest.gid);
          pBVar1 = (this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
          (*pBVar1->_vptr_BaseTimeCoordinator[7])(pBVar1,(ulong)(uint)dest_00.gid);
          pBVar1 = (this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
          (*pBVar1->_vptr_BaseTimeCoordinator[7])(pBVar1,(ulong)(uint)dest.gid);
          (this->super_BrokerBase).hasTimeDependency = false;
          ActionMessage::ActionMessage(&local_1a0,cmd_remove_interdependency);
          local_1a0.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
          routeMessage(this,&local_1a0,dest_00);
          routeMessage(this,&local_1a0,dest);
          local_e8.source_id.gid = dest.gid;
          if (uVar13 == 0) {
            if (bVar3) {
              ActionMessage::ActionMessage(&local_e8,cmd_add_dependency);
              local_e8.flags = local_e8.flags | 0x4000;
              routeMessage(this,&local_e8,dest_00);
              ActionMessage::setAction(&local_e8,cmd_add_dependent);
              local_e8.flags = local_e8.flags & 0x9fff | 0x2000;
              local_e8.source_id.gid = dest_00.gid;
              routeMessage(this,&local_e8,dest);
            }
            else {
              ActionMessage::ActionMessage(&local_e8,cmd_add_interdependency);
              local_e8.flags = local_e8.flags | 0x4000;
              routeMessage(this,&local_e8,dest_00);
              routeMessage(this,&local_e8,dest);
              local_e8.flags = local_e8.flags & 0x9fff | 0x2000;
              local_e8.source_id.gid = dest_00.gid;
              routeMessage(this,&local_e8,dest);
            }
          }
          else {
            ActionMessage::ActionMessage(&local_e8,cmd_add_dependent);
            local_e8.flags = local_e8.flags | 0x4000;
            routeMessage(this,&local_e8,dest_00);
            ActionMessage::setAction(&local_e8,cmd_add_dependency);
            local_e8.flags = local_e8.flags & 0x9fff | 0x2000;
            local_e8.source_id.gid = dest_00.gid;
            routeMessage(this,&local_e8,dest);
          }
          ActionMessage::~ActionMessage(&local_e8);
          ActionMessage::~ActionMessage(&local_1a0);
        }
      }
    }
  }
  return;
}

Assistant:

FederateState* CommonCore::getFederate(std::string_view federateName) const
{
    auto feds = federates.lock();
    return feds->find(std::string(federateName));
}